

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall UdpSocketTest::Run(UdpSocketTest *this)

{
  int local_3cc;
  int local_3c8;
  uint32_t new_number;
  uint32_t number;
  int res;
  Address client_addr;
  Address server_addr;
  ServerSocket server;
  Socket sock;
  Selector local_288 [8];
  Selector s;
  UdpSocketTest *this_local;
  
  Selector::Selector(local_288,(char *)0x0);
  JetHead::Socket::Socket((Socket *)&stack0xfffffffffffffd08,false);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)(server_addr.mName + 8),false);
  JetHead::Socket::Address::Address((Address *)(client_addr.mName + 8));
  JetHead::Socket::Address::Address((Address *)&number);
  new_number = JetHead::ServerSocket::bind((Address *)(server_addr.mName + 8));
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x5d,"Bind Failed");
  }
  new_number = JetHead::Socket::getLocalAddress((Address *)(server_addr.mName + 8));
  JetHead::Socket::Address::setAddress(client_addr.mName + 8);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,99,"get local addr failed");
  }
  JetHead::Socket::setSelector
            ((SocketListener *)(server_addr.mName + 8),(Selector *)&this->super_SocketListener);
  new_number = JetHead::Socket::connect((Address *)&stack0xfffffffffffffd08);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x6b,"connect failed");
  }
  new_number = JetHead::Socket::getLocalAddress((Address *)&stack0xfffffffffffffd08);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x70,"get local addr failed");
  }
  new_number = JetHead::Socket::connect((Address *)(server_addr.mName + 8));
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x75,"server connet failed");
  }
  local_3c8 = 1000;
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x7b,"connect failed");
  }
  new_number = JetHead::Socket::write(&stack0xfffffffffffffd08,(int)&local_3c8);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x80,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xfffffffffffffd08,(int)&local_3cc);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x85,"read failed");
  }
  if (local_3cc != local_3c8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x88,"Data Read failed");
  }
  local_3c8 = local_3cc + 1;
  new_number = JetHead::Socket::write(&stack0xfffffffffffffd08,(int)&local_3c8);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x8f,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xfffffffffffffd08,(int)&local_3cc);
  if (local_3cc != local_3c8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x94,"FAILED");
  }
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x97,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  usleep(100000);
  TestCase::TestPassed(&this->super_TestCase);
  JetHead::Socket::Address::~Address((Address *)&number);
  JetHead::Socket::Address::~Address((Address *)(client_addr.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)(server_addr.mName + 8));
  JetHead::Socket::~Socket((Socket *)&stack0xfffffffffffffd08);
  Selector::~Selector(local_288);
  return;
}

Assistant:

void UdpSocketTest::Run()
{	
	LOG_NOTICE( "UDP Test Started" );

	Selector s;

	Socket sock( false );
	ServerSocket server( false );
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		TestFailed( "Bind Failed" );
		
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		TestFailed( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	
	server.setSelector( this, &s );
	res = sock.connect( server_addr );

	if ( res < 0 )
		TestFailed( "connect failed" );
	
	res = sock.getLocalAddress( client_addr );

	if ( res < 0 )
		TestFailed( "get local addr failed" );

	res = server.connect( client_addr );

	if ( res < 0 )
		TestFailed( "server connet failed" );
	
	uint32_t number = 1000;
	uint32_t new_number;
	
	if ( res < 0 )
		TestFailed( "connect failed" );
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		TestFailed( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( res < 0 )
		TestFailed( "read failed" );

	if ( new_number != number + 1 )
		TestFailed( "Data Read failed" );
	
	number = new_number + 1;
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		TestFailed( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		TestFailed( "FAILED" );
	
	if ( res < 0 )
		TestFailed( "write failed" );
	
	LOG_NOTICE( "Data sent" );
	
	mTestState = 0;
	
	sock.close();
	usleep( 100000 );
	
	TestPassed();
}